

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.h
# Opt level: O2

bool __thiscall CNscPStackEntry::IsIntegerPowerOf2(CNscPStackEntry *this)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = IsSimpleConstant(this);
  if (bVar1) {
    if (this->m_nType != NscType_Integer) {
      __assert_fail("GetType () == NscType_Integer",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                    ,0x1a2,"bool CNscPStackEntry::IsIntegerPowerOf2() const");
    }
    uVar2 = GetInteger(this);
    bVar1 = (uVar2 & uVar2 - 1) == 0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IsIntegerPowerOf2 () const
	{
		unsigned int nValue;

		if (!IsSimpleConstant ())
			return false;

		assert (GetType () == NscType_Integer);
		nValue = (unsigned int) GetInteger ();

		return (nValue & (nValue - 1)) == 0;
	}